

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2icrs.cpp
# Opt level: O0

void PrintResults(CESkyCoord *input,CESkyCoord *output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long *plVar4;
  reference pvVar5;
  long *in_RSI;
  CEDate *in_RDI;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> out_dms;
  vector<double,_std::allocator<double>_> out_hms;
  undefined8 in_stack_fffffffffffffd40;
  CEDateType date_format;
  double in_stack_fffffffffffffd48;
  CEDate *in_stack_fffffffffffffd50;
  CEDate *pCVar8;
  CEAngle *in_stack_fffffffffffffda8;
  undefined1 local_230 [8];
  CEAngle *in_stack_fffffffffffffdd8;
  CEAngle local_1f0;
  undefined1 local_1e0 [64];
  CEAngle local_1a0;
  undefined1 local_190 [64];
  CEAngle local_150;
  undefined1 local_140 [64];
  CEAngle local_100;
  undefined1 local_f0 [64];
  undefined1 local_b0 [56];
  undefined1 local_78 [64];
  undefined1 local_38 [16];
  vector<double,_std::allocator<double>_> local_28;
  long *local_10;
  CEDate *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,date_format);
  (**(code **)(*in_RSI + 0x18))(local_38,in_RSI,local_78);
  CEAngle::HmsVect(in_stack_fffffffffffffda8);
  CEAngle::~CEAngle((CEAngle *)0x136e8a);
  CEDate::~CEDate((CEDate *)0x136e97);
  plVar4 = local_10;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,date_format);
  (**(code **)(*plVar4 + 0x20))(local_b0,plVar4,local_f0);
  CEAngle::DmsVect(in_stack_fffffffffffffdd8);
  CEAngle::~CEAngle((CEAngle *)0x136f18);
  CEDate::~CEDate((CEDate *)0x136f25);
  printf("\n");
  printf("******************************************\n");
  printf("* Results of Galactic -> ICRS conversion *\n");
  printf("******************************************\n");
  printf("ICRS Coordinates (output)\n");
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,0);
  dVar7 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,1);
  dVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,2);
  dVar2 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,3);
  dVar3 = *pvVar5;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,date_format);
  (**(code **)(*local_10 + 0x18))(&local_100,local_10,local_140);
  dVar6 = CEAngle::Deg(&local_100);
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",dVar2 + dVar3,dVar6,
         (ulong)(uint)(int)dVar7,(ulong)(uint)(int)dVar1);
  CEAngle::~CEAngle((CEAngle *)0x137083);
  CEDate::~CEDate((CEDate *)0x137090);
  pCVar8 = local_8;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,date_format);
  (*pCVar8->_vptr_CEDate[4])(&local_150,pCVar8,local_190);
  dVar7 = CEAngle::Deg(&local_150);
  printf("    Declination    : %+f degrees\n",dVar7);
  CEAngle::~CEAngle((CEAngle *)0x137119);
  CEDate::~CEDate((CEDate *)0x137126);
  printf("Galactic Coordinates (input)\n");
  pCVar8 = local_8;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar8,in_stack_fffffffffffffd48,date_format);
  (*pCVar8->_vptr_CEDate[3])(&local_1a0,pCVar8,local_1e0);
  dVar7 = CEAngle::Deg(&local_1a0);
  printf("    Galactic Lon.: %f degrees\n",dVar7);
  CEAngle::~CEAngle((CEAngle *)0x1371bf);
  CEDate::~CEDate((CEDate *)0x1371cc);
  this = (vector<double,_std::allocator<double>_> *)CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar8,dVar7,(CEDateType)((ulong)this >> 0x20));
  (*local_8->_vptr_CEDate[4])(&local_1f0,local_8,local_230);
  dVar7 = CEAngle::Deg(&local_1f0);
  printf("    Galactic Lat.: %+f degrees\n",dVar7);
  CEAngle::~CEAngle((CEAngle *)0x137255);
  CEDate::~CEDate((CEDate *)0x137262);
  printf("\n");
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return;
}

Assistant:

void PrintResults(const CESkyCoord& input,
                  const CESkyCoord& output)
{
    // Get the representation of the input icrs in hours, minutes, seconds
    std::vector<double> out_hms = output.XCoord().HmsVect();
    std::vector<double> out_dms = output.YCoord().DmsVect();
    
    std::printf("\n");
    std::printf("******************************************\n");
    std::printf("* Results of Galactic -> ICRS conversion *\n");
    std::printf("******************************************\n");
    std::printf("ICRS Coordinates (output)\n");
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(out_hms[0]), int(out_hms[1]), out_hms[2]+out_hms[3],
                output.XCoord().Deg());
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg());
    std::printf("Galactic Coordinates (input)\n");
    std::printf("    Galactic Lon.: %f degrees\n", input.XCoord().Deg());
    std::printf("    Galactic Lat.: %+f degrees\n", input.YCoord().Deg());
    std::printf("\n");
}